

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemTranslate(Mem *pMem,u8 desiredEnc)

{
  uchar uVar1;
  ushort uVar2;
  byte bVar3;
  int iVar4;
  uchar *puVar5;
  uchar *puVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  bool bVar10;
  int c2_1;
  int c2;
  int rc;
  u8 temp;
  byte *pbStack_40;
  uint c;
  uchar *z;
  uchar *zTerm;
  uchar *zIn;
  uchar *zOut;
  int len;
  u8 desiredEnc_local;
  Mem *pMem_local;
  
  if ((pMem->enc == '\x01') || (desiredEnc == '\x01')) {
    if (desiredEnc == '\x01') {
      pMem->n = pMem->n & 0xfffffffe;
      zOut._0_4_ = pMem->n * 2 + 1;
    }
    else {
      zOut._0_4_ = pMem->n * 2 + 2;
    }
    zTerm = (uchar *)pMem->z;
    pbVar7 = zTerm + pMem->n;
    pbVar8 = (byte *)sqlite3DbMallocRaw(pMem->db,(long)(int)zOut);
    if (pbVar8 == (byte *)0x0) {
      return 7;
    }
    pbStack_40 = pbVar8;
    if (pMem->enc == '\x01') {
      if (desiredEnc == '\x02') {
        while (zTerm < pbVar7) {
          puVar5 = zTerm + 1;
          rc = (int)*zTerm;
          zTerm = puVar5;
          if (0xbf < (uint)rc) {
            rc = (int)""[rc - 0xc0];
            while( true ) {
              bVar10 = false;
              if (zTerm != pbVar7) {
                bVar10 = (*zTerm & 0xc0) == 0x80;
              }
              if (!bVar10) break;
              rc = rc * 0x40 + (*zTerm & 0x3f);
              zTerm = zTerm + 1;
            }
            if ((((uint)rc < 0x80) || ((rc & 0xfffff800U) == 0xd800)) ||
               ((rc & 0xfffffffeU) == 0xfffe)) {
              rc = 0xfffd;
            }
          }
          bVar3 = (byte)((uint)rc >> 8);
          if ((uint)rc < 0x10000) {
            pbVar9 = pbStack_40 + 1;
            *pbStack_40 = (byte)rc;
            pbStack_40 = pbStack_40 + 2;
            *pbVar9 = bVar3;
          }
          else {
            *pbStack_40 = ((byte)((uint)rc >> 10) & 0x3f) + ((byte)(rc - 0x10000U >> 10) & 0xc0);
            pbStack_40[1] = ((byte)(rc - 0x10000U >> 0x12) & 3) - 0x28;
            pbVar9 = pbStack_40 + 3;
            pbStack_40[2] = (byte)rc;
            pbStack_40 = pbStack_40 + 4;
            *pbVar9 = (bVar3 & 3) - 0x24;
          }
        }
      }
      else {
        while (zTerm < pbVar7) {
          puVar5 = zTerm + 1;
          rc = (int)*zTerm;
          zTerm = puVar5;
          if (0xbf < (uint)rc) {
            rc = (int)""[rc - 0xc0];
            while( true ) {
              bVar10 = false;
              if (zTerm != pbVar7) {
                bVar10 = (*zTerm & 0xc0) == 0x80;
              }
              if (!bVar10) break;
              rc = rc * 0x40 + (*zTerm & 0x3f);
              zTerm = zTerm + 1;
            }
            if ((((uint)rc < 0x80) || ((rc & 0xfffff800U) == 0xd800)) ||
               ((rc & 0xfffffffeU) == 0xfffe)) {
              rc = 0xfffd;
            }
          }
          bVar3 = (byte)((uint)rc >> 8);
          if ((uint)rc < 0x10000) {
            pbVar9 = pbStack_40 + 1;
            *pbStack_40 = bVar3;
            pbStack_40 = pbStack_40 + 2;
            *pbVar9 = (byte)rc;
          }
          else {
            *pbStack_40 = ((byte)(rc - 0x10000U >> 0x12) & 3) - 0x28;
            pbStack_40[1] = ((byte)((uint)rc >> 10) & 0x3f) + ((byte)(rc - 0x10000U >> 10) & 0xc0);
            pbVar9 = pbStack_40 + 3;
            pbStack_40[2] = (bVar3 & 3) - 0x24;
            pbStack_40 = pbStack_40 + 4;
            *pbVar9 = (byte)rc;
          }
        }
      }
      pMem->n = (int)pbStack_40 - (int)pbVar8;
      *pbStack_40 = 0;
      pbStack_40 = pbStack_40 + 1;
    }
    else {
      if (pMem->enc == '\x02') {
        while (zTerm < pbVar7) {
          pbVar9 = zTerm + 2;
          rc = (uint)zTerm[1] * 0x100 + (uint)*zTerm;
          if (((0xd7ff < (uint)rc) && ((uint)rc < 0xe000)) && (pbVar9 < pbVar7)) {
            rc = ((uint)zTerm[3] * 0x100 + (uint)*pbVar9 & 0x3ff) + (rc & 0x3fU) * 0x400 +
                 ((rc & 0x3c0U) + 0x40) * 0x400;
            pbVar9 = zTerm + 4;
          }
          zTerm = pbVar9;
          bVar3 = (byte)rc;
          if ((uint)rc < 0x80) {
            *pbStack_40 = bVar3;
            pbStack_40 = pbStack_40 + 1;
          }
          else if ((uint)rc < 0x800) {
            pbVar9 = pbStack_40 + 1;
            *pbStack_40 = ((byte)((uint)rc >> 6) & 0x1f) - 0x40;
            pbStack_40 = pbStack_40 + 2;
            *pbVar9 = (bVar3 & 0x3f) + 0x80;
          }
          else if ((uint)rc < 0x10000) {
            *pbStack_40 = ((byte)((uint)rc >> 0xc) & 0xf) - 0x20;
            pbVar9 = pbStack_40 + 2;
            pbStack_40[1] = ((byte)((uint)rc >> 6) & 0x3f) + 0x80;
            pbStack_40 = pbStack_40 + 3;
            *pbVar9 = (bVar3 & 0x3f) + 0x80;
          }
          else {
            *pbStack_40 = ((byte)((uint)rc >> 0x12) & 7) - 0x10;
            pbStack_40[1] = ((byte)((uint)rc >> 0xc) & 0x3f) + 0x80;
            pbVar9 = pbStack_40 + 3;
            pbStack_40[2] = ((byte)((uint)rc >> 6) & 0x3f) + 0x80;
            pbStack_40 = pbStack_40 + 4;
            *pbVar9 = (bVar3 & 0x3f) + 0x80;
          }
        }
      }
      else {
        while (zTerm < pbVar7) {
          pbVar9 = zTerm + 2;
          rc = (uint)zTerm[1] + (uint)*zTerm * 0x100;
          if (((0xd7ff < (uint)rc) && ((uint)rc < 0xe000)) && (pbVar9 < pbVar7)) {
            rc = ((uint)zTerm[3] + (uint)*pbVar9 * 0x100 & 0x3ff) + (rc & 0x3fU) * 0x400 +
                 ((rc & 0x3c0U) + 0x40) * 0x400;
            pbVar9 = zTerm + 4;
          }
          zTerm = pbVar9;
          bVar3 = (byte)rc;
          if ((uint)rc < 0x80) {
            *pbStack_40 = bVar3;
            pbStack_40 = pbStack_40 + 1;
          }
          else if ((uint)rc < 0x800) {
            pbVar9 = pbStack_40 + 1;
            *pbStack_40 = ((byte)((uint)rc >> 6) & 0x1f) - 0x40;
            pbStack_40 = pbStack_40 + 2;
            *pbVar9 = (bVar3 & 0x3f) + 0x80;
          }
          else if ((uint)rc < 0x10000) {
            *pbStack_40 = ((byte)((uint)rc >> 0xc) & 0xf) - 0x20;
            pbVar9 = pbStack_40 + 2;
            pbStack_40[1] = ((byte)((uint)rc >> 6) & 0x3f) + 0x80;
            pbStack_40 = pbStack_40 + 3;
            *pbVar9 = (bVar3 & 0x3f) + 0x80;
          }
          else {
            *pbStack_40 = ((byte)((uint)rc >> 0x12) & 7) - 0x10;
            pbStack_40[1] = ((byte)((uint)rc >> 0xc) & 0x3f) + 0x80;
            pbVar9 = pbStack_40 + 3;
            pbStack_40[2] = ((byte)((uint)rc >> 6) & 0x3f) + 0x80;
            pbStack_40 = pbStack_40 + 4;
            *pbVar9 = (bVar3 & 0x3f) + 0x80;
          }
        }
      }
      pMem->n = (int)pbStack_40 - (int)pbVar8;
    }
    *pbStack_40 = 0;
    uVar2 = pMem->flags;
    sqlite3VdbeMemRelease(pMem);
    pMem->flags = uVar2 & 0x801f | 0x202;
    pMem->enc = desiredEnc;
    pMem->z = (char *)pbVar8;
    pMem->zMalloc = pMem->z;
    iVar4 = sqlite3DbMallocSize(pMem->db,pMem->z);
    pMem->szMalloc = iVar4;
  }
  else {
    iVar4 = sqlite3VdbeMemMakeWriteable(pMem);
    if (iVar4 != 0) {
      return 7;
    }
    zTerm = (uchar *)pMem->z;
    puVar5 = zTerm + (int)(pMem->n & 0xfffffffe);
    while (zTerm < puVar5) {
      uVar1 = *zTerm;
      *zTerm = zTerm[1];
      puVar6 = zTerm + 1;
      zTerm = zTerm + 2;
      *puVar6 = uVar1;
    }
    pMem->enc = desiredEnc;
  }
  return 0;
}

Assistant:

int sqlite3VdbeMemTranslate(Mem *pMem, u8 desiredEnc){
  int len;                    /* Maximum length of output string in bytes */
  unsigned char *zOut;                  /* Output buffer */
  unsigned char *zIn;                   /* Input iterator */
  unsigned char *zTerm;                 /* End of input */
  unsigned char *z;                     /* Output iterator */
  unsigned int c;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( pMem->flags&MEM_Str );
  assert( pMem->enc!=desiredEnc );
  assert( pMem->enc!=0 );
  assert( pMem->n>=0 );

#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    char zBuf[100];
    sqlite3VdbeMemPrettyPrint(pMem, zBuf);
    fprintf(stderr, "INPUT:  %s\n", zBuf);
  }
#endif

  /* If the translation is between UTF-16 little and big endian, then 
  ** all that is required is to swap the byte order. This case is handled
  ** differently from the others.
  */
  if( pMem->enc!=SQLITE_UTF8 && desiredEnc!=SQLITE_UTF8 ){
    u8 temp;
    int rc;
    rc = sqlite3VdbeMemMakeWriteable(pMem);
    if( rc!=SQLITE_OK ){
      assert( rc==SQLITE_NOMEM );
      return SQLITE_NOMEM_BKPT;
    }
    zIn = (u8*)pMem->z;
    zTerm = &zIn[pMem->n&~1];
    while( zIn<zTerm ){
      temp = *zIn;
      *zIn = *(zIn+1);
      zIn++;
      *zIn++ = temp;
    }
    pMem->enc = desiredEnc;
    goto translate_out;
  }

  /* Set len to the maximum number of bytes required in the output buffer. */
  if( desiredEnc==SQLITE_UTF8 ){
    /* When converting from UTF-16, the maximum growth results from
    ** translating a 2-byte character to a 4-byte UTF-8 character.
    ** A single byte is required for the output string
    ** nul-terminator.
    */
    pMem->n &= ~1;
    len = pMem->n * 2 + 1;
  }else{
    /* When converting from UTF-8 to UTF-16 the maximum growth is caused
    ** when a 1-byte UTF-8 character is translated into a 2-byte UTF-16
    ** character. Two bytes are required in the output buffer for the
    ** nul-terminator.
    */
    len = pMem->n * 2 + 2;
  }

  /* Set zIn to point at the start of the input buffer and zTerm to point 1
  ** byte past the end.
  **
  ** Variable zOut is set to point at the output buffer, space obtained
  ** from sqlite3_malloc().
  */
  zIn = (u8*)pMem->z;
  zTerm = &zIn[pMem->n];
  zOut = sqlite3DbMallocRaw(pMem->db, len);
  if( !zOut ){
    return SQLITE_NOMEM_BKPT;
  }
  z = zOut;

  if( pMem->enc==SQLITE_UTF8 ){
    if( desiredEnc==SQLITE_UTF16LE ){
      /* UTF-8 -> UTF-16 Little-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16LE(z, c);
      }
    }else{
      assert( desiredEnc==SQLITE_UTF16BE );
      /* UTF-8 -> UTF-16 Big-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16BE(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
    *z++ = 0;
  }else{
    assert( desiredEnc==SQLITE_UTF8 );
    if( pMem->enc==SQLITE_UTF16LE ){
      /* UTF-16 Little-endian -> UTF-8 */
      while( zIn<zTerm ){
        READ_UTF16LE(zIn, zIn<zTerm, c); 
        WRITE_UTF8(z, c);
      }
    }else{
      /* UTF-16 Big-endian -> UTF-8 */
      while( zIn<zTerm ){
        READ_UTF16BE(zIn, zIn<zTerm, c); 
        WRITE_UTF8(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
  }
  *z = 0;
  assert( (pMem->n+(desiredEnc==SQLITE_UTF8?1:2))<=len );

  c = pMem->flags;
  sqlite3VdbeMemRelease(pMem);
  pMem->flags = MEM_Str|MEM_Term|(c&(MEM_AffMask|MEM_Subtype));
  pMem->enc = desiredEnc;
  pMem->z = (char*)zOut;
  pMem->zMalloc = pMem->z;
  pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->z);

translate_out:
#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    char zBuf[100];
    sqlite3VdbeMemPrettyPrint(pMem, zBuf);
    fprintf(stderr, "OUTPUT: %s\n", zBuf);
  }
#endif
  return SQLITE_OK;
}